

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int MemHashReplace(unqlite_kv_engine *pKv,void *pKey,int nKeyLen,void *pData,unqlite_int64 nDataLen)

{
  sxu32 sVar1;
  mem_hash_record *pmVar2;
  void *pDest;
  int iVar3;
  
  if (0xffffffff < nDataLen) {
    (*pKv->pIo->xErr)(pKv->pIo->pHandle,"Record size limit reached");
    return -7;
  }
  pmVar2 = MemHashGetEntry((mem_hash_kv_engine *)pKv,pKey,nKeyLen);
  if (pmVar2 == (mem_hash_record *)0x0) {
    sVar1 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
    pmVar2 = MemHashNewRecord((mem_hash_kv_engine *)pKv,pKey,nKeyLen,pData,nDataLen,sVar1);
    if (pmVar2 != (mem_hash_record *)0x0) {
      MemHashLinkRecord((mem_hash_kv_engine *)pKv,pmVar2);
      if (99999 < *(uint *)&pKv[0x1a].pIo) {
        return 0;
      }
      if (*(uint *)&pKv[0x1a].pIo < (uint)(*(int *)((long)&pKv[0x1a].pIo + 4) << 2)) {
        return 0;
      }
      MemHashGrowTable((mem_hash_kv_engine *)pKv);
      return 0;
    }
LAB_0011079c:
    iVar3 = -1;
  }
  else {
    sVar1 = (sxu32)nDataLen;
    if (pmVar2->nDataLen == sVar1) {
      pDest = pmVar2->pData;
    }
    else {
      pDest = SyMemBackendAlloc((SyMemBackend *)(pKv + 1),sVar1);
      if (pDest == (void *)0x0) goto LAB_0011079c;
      SyMemBackendFree((SyMemBackend *)(pKv + 1),pmVar2->pData);
    }
    pmVar2->nDataLen = sVar1;
    SyMemcpy(pData,pDest,sVar1);
    pmVar2->pData = pDest;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int MemHashReplace(
	  unqlite_kv_engine *pKv,
	  const void *pKey,int nKeyLen,
	  const void *pData,unqlite_int64 nDataLen
	  )
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKv;
	mem_hash_record *pRecord;
	if( nDataLen > SXU32_HIGH ){
		/* Database limit */
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"Record size limit reached");
		return UNQLITE_LIMIT;
	}
	/* Fetch the record first */
	pRecord = MemHashGetEntry(pEngine,pKey,nKeyLen);
	if( pRecord == 0 ){
		/* Allocate a new record */
		pRecord = MemHashNewRecord(pEngine,
			pKey,nKeyLen,
			pData,nDataLen,
			pEngine->xHash(pKey,nKeyLen)
			);
		if( pRecord == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Link the entry */
		MemHashLinkRecord(pEngine,pRecord);
		if( (pEngine->nRecord >= pEngine->nBucket * MEM_HASH_FILL_FACTOR) && pEngine->nRecord < 100000 ){
			/* Rehash the table */
			MemHashGrowTable(pEngine);
		}
	}else{
		sxu32 nData = (sxu32)nDataLen;
		void *pNew;
		/* Replace an existing record */
		if( nData == pRecord->nDataLen ){
			/* No need to free the old chunk */
			pNew = (void *)pRecord->pData;
		}else{
			pNew = SyMemBackendAlloc(&pEngine->sAlloc,nData);
			if( pNew == 0 ){
				return UNQLITE_NOMEM;
			}
			/* Release the old data */
			SyMemBackendFree(&pEngine->sAlloc,(void *)pRecord->pData);
		}
		/* Reflect the change */
		pRecord->nDataLen = nData;
		SyMemcpy(pData,pNew,nData);
		pRecord->pData = pNew;
	}
	return UNQLITE_OK;
}